

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_drds_describe_drds_db_ip_white_list.cc
# Opt level: O2

int __thiscall
aliyun::Drds::DescribeDrdsDBIpWhiteList
          (Drds *this,DrdsDescribeDrdsDBIpWhiteListRequestType *req,
          DrdsDescribeDrdsDBIpWhiteListResponseType *response,DrdsErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  AliRpcRequest *this_00;
  Value *pVVar4;
  Value *pVVar5;
  uint index;
  char *pcVar6;
  allocator<char> local_384;
  allocator<char> local_383;
  allocator<char> local_382;
  allocator<char> local_381;
  Value val;
  string local_368;
  DrdsDescribeDrdsDBIpWhiteListResponseType *local_348;
  value_type local_340;
  string str_response;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar6 = "http";
  if (this->use_tls_ != false) {
    pcVar6 = "https";
  }
  local_348 = response;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar6,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)&local_368);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&local_340);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar6 = this->proxy_host_, pcVar6 != (char *)0x0)) &&
     (*pcVar6 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar6,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)&local_368);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"DescribeDrdsDBIpWhiteList",(allocator<char> *)&local_340);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->drds_instance_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"DrdsInstanceId",(allocator<char> *)&local_368);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->db_name)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"DbName",(allocator<char> *)&local_368);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->db_name);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"RegionId",(allocator<char> *)&local_368);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,this->region_id_,(allocator<char> *)&local_340);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (DrdsErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_368,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_368,anon_var_dwarf_fb9f7 + 9,&local_381);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_368);
        std::__cxx11::string::~string((string *)&local_368);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_368,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_368,anon_var_dwarf_fb9f7 + 9,&local_382);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_368);
        std::__cxx11::string::~string((string *)&local_368);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_368,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_368,anon_var_dwarf_fb9f7 + 9,&local_383);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_368);
        std::__cxx11::string::~string((string *)&local_368);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_368,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_368,anon_var_dwarf_fb9f7 + 9,&local_384);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_368);
        std::__cxx11::string::~string((string *)&local_368);
      }
      if (local_348 != (DrdsDescribeDrdsDBIpWhiteListResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"Success");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Success");
          bVar1 = Json::Value::asBool(pVVar4);
          local_348->success = bVar1;
        }
        bVar1 = Json::Value::isMember(&val,"Data");
        iVar2 = 200;
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Data");
          bVar1 = Json::Value::isMember(pVVar4,"IpWhiteList");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](pVVar4,"IpWhiteList");
            bVar1 = Json::Value::isMember(pVVar5,"Ip");
            if (bVar1) {
              pVVar4 = Json::Value::operator[](pVVar4,"IpWhiteList");
              pVVar4 = Json::Value::operator[](pVVar4,"Ip");
              bVar1 = Json::Value::isArray(pVVar4);
              if (bVar1) {
                for (index = 0; AVar3 = Json::Value::size(pVVar4), index < AVar3; index = index + 1)
                {
                  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
                  local_340._M_string_length = 0;
                  local_340.field_2._M_local_buf[0] = '\0';
                  pVVar5 = Json::Value::operator[](pVVar4,index);
                  Json::Value::asString_abi_cxx11_(&local_368,pVVar5);
                  std::__cxx11::string::operator=((string *)&local_340,(string *)&local_368);
                  std::__cxx11::string::~string((string *)&local_368);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_348,&local_340);
                  std::__cxx11::string::~string((string *)&local_340);
                }
              }
            }
          }
        }
      }
      goto LAB_001315ce;
    }
  }
  iVar2 = -1;
  if (error_info != (DrdsErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_001315ce:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Drds::DescribeDrdsDBIpWhiteList(const DrdsDescribeDrdsDBIpWhiteListRequestType& req,
                      DrdsDescribeDrdsDBIpWhiteListResponseType* response,
                       DrdsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeDrdsDBIpWhiteList");
  if(!req.drds_instance_id.empty()) {
    req_rpc->AddRequestQuery("DrdsInstanceId", req.drds_instance_id);
  }
  if(!req.db_name.empty()) {
    req_rpc->AddRequestQuery("DbName", req.db_name);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}